

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthMinCofSuppOverlap(uint *pTruth,int nVars,int *pVarMin)

{
  int iVar1;
  uint uWord;
  uint uVar2;
  uint uWord_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar;
  
  if (9 < nVars) {
    __assert_fail("nVars <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                  ,0x529,"int Kit_TruthMinCofSuppOverlap(unsigned int *, int, int *)");
  }
  iVar = 0;
  iVar1 = 0;
  if (0 < nVars) {
    iVar1 = nVars;
  }
  iVar6 = 0x20;
  iVar5 = -1;
  do {
    if (iVar1 == iVar) goto LAB_004d39af;
    Kit_TruthCopy(Kit_TruthMinCofSuppOverlap::uCofactor,pTruth,nVars);
    Kit_TruthCofactor0(Kit_TruthMinCofSuppOverlap::uCofactor,nVars,iVar);
    uWord = Kit_TruthSupport(Kit_TruthMinCofSuppOverlap::uCofactor,nVars);
    uVar2 = Kit_WordCountOnes(uWord);
    Kit_TruthCopy(Kit_TruthMinCofSuppOverlap::uCofactor,pTruth,nVars);
    Kit_TruthCofactor1(Kit_TruthMinCofSuppOverlap::uCofactor,nVars,iVar);
    uWord_00 = Kit_TruthSupport(Kit_TruthMinCofSuppOverlap::uCofactor,nVars);
    uVar3 = Kit_WordCountOnes(uWord_00);
    iVar4 = Kit_WordCountOnes(uWord_00 & uWord);
    if ((uVar3 < 6 && uVar2 < 6) && iVar4 < iVar6) {
      iVar6 = iVar4;
      iVar5 = iVar;
    }
    iVar = iVar + 1;
  } while (iVar6 != 0);
  iVar6 = 0;
LAB_004d39af:
  if (pVarMin != (int *)0x0) {
    *pVarMin = iVar5;
  }
  return iVar6;
}

Assistant:

int Kit_TruthMinCofSuppOverlap( unsigned * pTruth, int nVars, int * pVarMin )
{
    static unsigned uCofactor[16];
    int i, ValueCur, ValueMin, VarMin;
    unsigned uSupp0, uSupp1;
    int nVars0, nVars1;
    assert( nVars <= 9 );
    ValueMin = 32;
    VarMin   = -1;
    for ( i = 0; i < nVars; i++ )
    {
        // get negative cofactor
        Kit_TruthCopy( uCofactor, pTruth, nVars );
        Kit_TruthCofactor0( uCofactor, nVars, i );
        uSupp0 = Kit_TruthSupport( uCofactor, nVars );
        nVars0 = Kit_WordCountOnes( uSupp0 );
//Kit_PrintBinary( stdout, &uSupp0, 8 ); printf( "\n" );
        // get positive cofactor
        Kit_TruthCopy( uCofactor, pTruth, nVars );
        Kit_TruthCofactor1( uCofactor, nVars, i );
        uSupp1 = Kit_TruthSupport( uCofactor, nVars );
        nVars1 = Kit_WordCountOnes( uSupp1 );
//Kit_PrintBinary( stdout, &uSupp1, 8 ); printf( "\n" );
        // get the number of common vars
        ValueCur = Kit_WordCountOnes( uSupp0 & uSupp1 );
        if ( ValueMin > ValueCur && nVars0 <= 5 && nVars1 <= 5 )
        {
            ValueMin = ValueCur;
            VarMin = i;
        }
        if ( ValueMin == 0 )
            break;
    }
    if ( pVarMin )
        *pVarMin = VarMin;
    return ValueMin;
}